

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::Swap(DescriptorProto *this,DescriptorProto *other)

{
  DescriptorProto *other_local;
  DescriptorProto *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->name_,&other->name_);
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Swap(&this->field_,&other->field_);
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Swap
              (&this->extension_,&other->extension_);
    RepeatedPtrField<google::protobuf::DescriptorProto>::Swap
              (&this->nested_type_,&other->nested_type_);
    RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Swap
              (&this->enum_type_,&other->enum_type_);
    RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Swap
              (&this->extension_range_,&other->extension_range_);
    std::swap<google::protobuf::MessageOptions*>(&this->options_,&other->options_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void DescriptorProto::Swap(DescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    field_.Swap(&other->field_);
    extension_.Swap(&other->extension_);
    nested_type_.Swap(&other->nested_type_);
    enum_type_.Swap(&other->enum_type_);
    extension_range_.Swap(&other->extension_range_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}